

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O0

bool __thiscall
Js::ProbeContainer::AdvanceToNextUserStatement
          (ProbeContainer *this,FunctionBody *functionBody,ByteCodeReader *reader)

{
  bool bVar1;
  uint uVar2;
  int local_30;
  int local_2c;
  int nextStatementOffset;
  int currentOffset;
  ByteCodeReader *reader_local;
  FunctionBody *functionBody_local;
  ProbeContainer *this_local;
  
  _nextStatementOffset = reader;
  reader_local = (ByteCodeReader *)functionBody;
  functionBody_local = (FunctionBody *)this;
  uVar2 = ByteCodeReader::GetCurrentOffset(reader);
  local_2c = uVar2 - 1;
  bVar1 = GetNextUserStatementOffsetForAdvance
                    (this,(FunctionBody *)reader_local,_nextStatementOffset,local_2c,&local_30);
  if (bVar1) {
    ByteCodeReader::SetCurrentOffset(_nextStatementOffset,local_30);
  }
  return bVar1;
}

Assistant:

bool ProbeContainer::AdvanceToNextUserStatement(Js::FunctionBody* functionBody, ByteCodeReader* reader)
    {
        // Move back a byte to make sure we are within the bounds of
        // our current statement (See DispatchExceptionBreakpoint)
        int currentOffset = reader->GetCurrentOffset() - 1;
        int nextStatementOffset;

        if (this->GetNextUserStatementOffsetForAdvance(functionBody, reader, currentOffset, &nextStatementOffset))
        {
            reader->SetCurrentOffset(nextStatementOffset);
            return true;
        }
        return false;
    }